

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

void Abc_NtkTimeScale(Abc_Ntk_t *pNtk,float Scale)

{
  undefined8 uVar1;
  Abc_ManTime_t *pAVar2;
  void **ppvVar3;
  undefined8 *puVar4;
  float fVar5;
  float fVar6;
  Abc_Obj_t *pAVar7;
  int iVar8;
  
  pAVar2 = pNtk->pManTime;
  if (pAVar2 != (Abc_ManTime_t *)0x0) {
    fVar5 = (pAVar2->tReqDef).Rise;
    fVar6 = (pAVar2->tReqDef).Fall;
    (pAVar2->tArrDef).Rise = (pAVar2->tArrDef).Rise * Scale;
    (pAVar2->tArrDef).Fall = (pAVar2->tArrDef).Fall * Scale;
    (pAVar2->tReqDef).Rise = fVar5 * Scale;
    (pAVar2->tReqDef).Fall = fVar6 * Scale;
    ppvVar3 = pAVar2->vArrs->pArray;
    for (iVar8 = 0; iVar8 < pNtk->vCis->nSize; iVar8 = iVar8 + 1) {
      pAVar7 = Abc_NtkCi(pNtk,iVar8);
      puVar4 = (undefined8 *)ppvVar3[pAVar7->Id];
      uVar1 = *puVar4;
      *puVar4 = CONCAT44((float)((ulong)uVar1 >> 0x20) * Scale,(float)uVar1 * Scale);
    }
    ppvVar3 = pNtk->pManTime->vReqs->pArray;
    for (iVar8 = 0; iVar8 < pNtk->vCos->nSize; iVar8 = iVar8 + 1) {
      pAVar7 = Abc_NtkCo(pNtk,iVar8);
      puVar4 = (undefined8 *)ppvVar3[pAVar7->Id];
      uVar1 = *puVar4;
      *puVar4 = CONCAT44((float)((ulong)uVar1 >> 0x20) * Scale,(float)uVar1 * Scale);
    }
  }
  return;
}

Assistant:

void Abc_NtkTimeScale( Abc_Ntk_t * pNtk, float Scale )
{
    Abc_Obj_t * pObj;
    Abc_Time_t ** ppTimes, * pTime;
    int i;
    if ( pNtk->pManTime == NULL )
        return;
    // arrival
    pNtk->pManTime->tArrDef.Fall *= Scale;
    pNtk->pManTime->tArrDef.Rise *= Scale;
    // departure
    pNtk->pManTime->tReqDef.Fall *= Scale;
    pNtk->pManTime->tReqDef.Rise *= Scale;
    // set the default timing
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vArrs->pArray;
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall *= Scale;
        pTime->Rise *= Scale;
    }
    // set the default timing
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vReqs->pArray;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall *= Scale;
        pTime->Rise *= Scale;
    }
}